

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

bool __thiscall Assembler::checkIfLdStr(Assembler *this,string *line)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined8 *puVar4;
  Assembler *this_00;
  string operand;
  string instruction;
  smatch regop;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string_type local_58;
  
  regop.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  regop._M_begin._M_current = (char *)0x0;
  regop.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  regop.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (line,&regop,&twoOperandInstructionOneRegisterOtherAnyAddrMode_abi_cxx11_,0);
  if (!bVar1) goto LAB_001098c8;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::str(&instruction,&regop,1);
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::str(&operand,&regop,2);
  bVar2 = std::operator==(&operand,"psw");
  iVar3 = 0x80;
  if (!bVar2) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_58,&regop,2);
    this_00 = (Assembler *)&stack0xffffffffffffffc8;
    std::__cxx11::string::substr((ulong)this_00,(ulong)&local_58);
    iVar3 = literalToDecimal(this_00,(string *)&stack0xffffffffffffffc8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
    std::__cxx11::string::~string((string *)&local_58);
    iVar3 = iVar3 << 4;
  }
  std::__cxx11::string::~string((string *)&operand);
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::str(&operand,&regop,3);
  std::__cxx11::string::string((string *)&local_b8,(string *)&instruction);
  std::__cxx11::string::string((string *)&local_d8,(string *)&operand);
  bVar2 = checkIfLdStrRegDir(this,&local_b8,iVar3,&local_d8);
  if (bVar2) {
LAB_0010989c:
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  else {
    std::__cxx11::string::string((string *)&local_f8,(string *)&instruction);
    std::__cxx11::string::string((string *)&local_118,(string *)&operand);
    bVar2 = checkIfLdStrAbsolute(this,&local_f8,iVar3,&local_118);
    if (bVar2) {
LAB_00109882:
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_f8);
      goto LAB_0010989c;
    }
    std::__cxx11::string::string((string *)&local_138,(string *)&instruction);
    std::__cxx11::string::string((string *)&local_158,(string *)&operand);
    bVar2 = checkIfLdStrMemDir(this,&local_138,iVar3,&local_158);
    if (bVar2) {
LAB_00109868:
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_138);
      goto LAB_00109882;
    }
    std::__cxx11::string::string((string *)&local_178,(string *)&instruction);
    std::__cxx11::string::string((string *)&local_198,(string *)&operand);
    bVar2 = checkIfLdStrPcRel(this,&local_178,iVar3,&local_198);
    if (bVar2) {
LAB_0010984e:
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_178);
      goto LAB_00109868;
    }
    std::__cxx11::string::string((string *)&local_1b8,(string *)&instruction);
    std::__cxx11::string::string((string *)&local_1d8,(string *)&operand);
    bVar2 = checkIfLdStrRegInd(this,&local_1b8,iVar3,&local_1d8);
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1b8);
      goto LAB_0010984e;
    }
    std::__cxx11::string::string((string *)&local_78,(string *)&instruction);
    std::__cxx11::string::string((string *)&local_98,(string *)&operand);
    bVar2 = checkIfLdStrRegIndDis(this,&local_78,iVar3,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
    if (!bVar2) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = &PTR__exception_0012bac8;
      __cxa_throw(puVar4,&AddressingError::typeinfo,std::exception::~exception);
    }
  }
  std::__cxx11::string::~string((string *)&operand);
  std::__cxx11::string::~string((string *)&instruction);
LAB_001098c8:
  std::
  _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&regop);
  return bVar1;
}

Assistant:

bool Assembler::checkIfLdStr(string line) {
    smatch regop;
    if (regex_match(line, regop, twoOperandInstructionOneRegisterOtherAnyAddrMode)) {
        string instruction = regop.str(1);
        int regD = (regop.str(2) == "psw") ? 8 : literalToDecimal(regop.str(2).substr(1));
        regD <<= 4;
        string operand = regop.str(3);
        if (checkIfLdStrRegDir(instruction, regD, operand) || checkIfLdStrAbsolute(instruction, regD, operand) ||
            checkIfLdStrMemDir(instruction, regD, operand) ||
            checkIfLdStrPcRel(instruction, regD, operand) ||
            checkIfLdStrRegInd(instruction, regD, operand) ||
            checkIfLdStrRegIndDis(instruction, regD, operand))
            return true;
        else throw AddressingError();
    }
    return false;
}